

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

Am_Value_List * __thiscall
Am_Value_List::Append(Am_Value_List *this,Am_Value_List *other_list,bool unique)

{
  Am_List_Item *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *pAVar3;
  Am_Value_List_Data *pAVar4;
  Am_List_Item **ppAVar5;
  
  pAVar4 = this->data;
  if (pAVar4 == (Am_Value_List_Data *)0x0) {
    pAVar4 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(pAVar4);
  }
  else {
    if ((!unique) || ((pAVar4->super_Am_Wrapper).refs == 1)) goto LAB_0022d794;
    iVar2 = (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar4 = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    if (pAVar3 != (Am_List_Item *)0x0) {
      ppAVar5 = &pAVar4->head;
      do {
        pAVar3 = pAVar3->prev;
        pAVar1 = *ppAVar5;
        ppAVar5 = &pAVar1->next;
      } while (pAVar3 != (Am_List_Item *)0x0);
      this->item = pAVar1;
    }
  }
  this->data = pAVar4;
LAB_0022d794:
  if (other_list->data == (Am_Value_List_Data *)0x0) {
    pAVar3 = other_list->item;
    goto LAB_0022d7bf;
  }
  pAVar3 = other_list->data->head;
  while( true ) {
    other_list->item = pAVar3;
LAB_0022d7bf:
    if (pAVar3 == (Am_List_Item *)0x0) break;
    Add(this,&pAVar3->super_Am_Value,Am_TAIL,false);
    if (other_list->item == (Am_List_Item *)0x0) {
      if (other_list->data == (Am_Value_List_Data *)0x0) {
        return this;
      }
      ppAVar5 = &other_list->data->head;
    }
    else {
      ppAVar5 = &other_list->item->next;
    }
    pAVar3 = *ppAVar5;
  }
  return this;
}

Assistant:

Am_Value_List &
Am_Value_List::Append(Am_Value_List other_list, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();

  for (other_list.Start(); !other_list.Last(); other_list.Next())
    Add(other_list.Get(), Am_TAIL, false); //only need to make me unique once
  return *this;
}